

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O2

void __thiscall Scanner::Scanner(Scanner *this)

{
  allocator_type local_1d;
  Lex local_1c;
  
  (this->buffer)._M_dataplus._M_p = (pointer)&(this->buffer).field_2;
  (this->buffer)._M_string_length = 0;
  (this->buffer).field_2._M_local_buf[0] = '\0';
  Lex::Lex(&local_1c);
  std::vector<Lex,_std::allocator<Lex>_>::vector(&this->lex_vec,0,&local_1c,&local_1d);
  Lex::~Lex(&local_1c);
  (this->buffer)._M_string_length = 0;
  *(this->buffer)._M_dataplus._M_p = '\0';
  this->STATE = H_ST;
  return;
}

Assistant:

Scanner::Scanner(): lex_vec(0, Lex()) {
    clear_buffer();
    STATE = H_ST;
}